

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O2

int mem_rawfile_open(char *filename,int rwmode,int *hdl)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int *piVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  size_t sVar15;
  byte *pbVar16;
  double *dvalues;
  byte *pbVar17;
  size_t msize;
  uint local_4d4;
  byte local_4c4;
  int local_4c0;
  int local_4bc;
  undefined4 local_4b8;
  undefined4 local_4b4;
  long local_4b0;
  byte *local_4a8;
  FILE *diskfile;
  size_t local_498;
  char *cptr2;
  size_t local_488;
  undefined4 local_47c;
  long local_478;
  long local_470;
  long local_468;
  long local_460;
  long local_458;
  int *local_448;
  fitsfile *fptr;
  char rootfile [1025];
  
  lVar11 = 1;
  local_478 = 1;
  local_470 = 1;
  local_468 = 1;
  local_460 = 1;
  local_458 = 1;
  local_488 = 0;
  cptr2 = (char *)0x0;
  if (rwmode != 0) {
    ffpmsg("cannot open raw binary file with WRITE access (mem_rawfile_open)");
    ffpmsg(filename);
    return 0x70;
  }
  pcVar7 = strchr(filename,0x5b);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "binary file name missing \'[\' character (mem_rawfile_open)";
    goto LAB_001326f7;
  }
  rootfile[0] = '\0';
  strncat(rootfile,filename,(long)pcVar7 - (long)filename);
  local_4a8 = (byte *)(pcVar7 + 1);
  do {
    pbVar17 = local_4a8;
    bVar1 = *pbVar17;
    local_4a8 = pbVar17 + 1;
  } while (bVar1 == 0x20);
  switch(bVar1) {
  case 0x42:
switchD_001326ee_caseD_62:
    local_4c0 = 8;
    local_47c = 0;
    local_4c4 = 0;
    bVar3 = 0;
    bVar1 = 0;
    bVar4 = false;
    break;
  case 0x43:
  case 0x45:
  case 0x47:
  case 0x48:
switchD_001326ee_caseD_63:
    pcVar7 = "error in raw binary file datatype (mem_rawfile_open)";
LAB_001326f7:
    ffpmsg(pcVar7);
    ffpmsg(filename);
    return 0x7d;
  case 0x44:
switchD_001326ee_caseD_64:
    lVar11 = 8;
    local_4c0 = -0x40;
    bVar4 = true;
    local_47c = 0;
    local_4c4 = 0;
    bVar3 = 0;
    bVar1 = 0;
    break;
  case 0x46:
switchD_001326ee_caseD_66:
    local_4c0 = -0x20;
    bVar1 = 1;
    bVar3 = 0;
    goto LAB_001327ea;
  case 0x49:
switchD_001326ee_caseD_69:
    local_4c0 = 0x10;
    local_4c4 = 1;
    local_47c = 0;
LAB_00132805:
    bVar3 = 0;
    bVar1 = 0;
    bVar4 = false;
    lVar11 = 2;
    break;
  case 0x4a:
switchD_001326ee_caseD_6a:
    local_4c0 = 0x20;
    bVar3 = 1;
    bVar1 = 0;
LAB_001327ea:
    local_4c4 = 0;
    local_47c = 0;
    bVar4 = false;
    lVar11 = 4;
    break;
  default:
    switch(bVar1) {
    case 0x62:
      goto switchD_001326ee_caseD_62;
    case 99:
    case 0x65:
    case 0x67:
    case 0x68:
      goto switchD_001326ee_caseD_63;
    case 100:
      goto switchD_001326ee_caseD_64;
    case 0x66:
      goto switchD_001326ee_caseD_66;
    case 0x69:
      goto switchD_001326ee_caseD_69;
    case 0x6a:
      goto switchD_001326ee_caseD_6a;
    default:
      if (bVar1 == 0x52) goto switchD_001326ee_caseD_66;
      if ((bVar1 != 0x55) && (bVar1 != 0x75)) {
        if (bVar1 != 0x72) goto switchD_001326ee_caseD_63;
        goto switchD_001326ee_caseD_66;
      }
      local_4c0 = 0x14;
      local_47c = 1;
      local_4c4 = 0;
      goto LAB_00132805;
    }
  }
  bVar2 = *local_4a8;
  if (bVar2 == 0x42) {
LAB_00132861:
    local_4a8 = pbVar17 + 2;
    local_4b4 = 1;
    local_4b8 = 0;
  }
  else {
    if (bVar2 == 0x4c) {
LAB_00132849:
      local_4a8 = pbVar17 + 2;
    }
    else {
      if (bVar2 == 0x62) goto LAB_00132861;
      if (bVar2 == 0x6c) goto LAB_00132849;
    }
    local_4b8 = 1;
    local_4b4 = 0;
  }
  pbVar17 = local_4a8;
  local_448 = hdl;
  local_478 = strtol((char *)local_4a8,&cptr2,10);
  pbVar16 = (byte *)cptr2;
  lVar10 = 1;
  local_4d4 = 1;
  lVar13 = local_478;
  lVar9 = lVar10;
  lVar14 = lVar10;
  lVar8 = lVar10;
  local_498 = lVar11;
  if (cptr2 == (char *)0x0) {
    pbVar16 = (byte *)0x0;
  }
  else if (*cptr2 == ',') {
    local_4b0 = local_478;
    lVar8 = strtol(cptr2 + 1,(char **)&local_4a8,10);
    pbVar17 = local_4a8;
    local_470 = lVar8;
    if (local_4a8 == (byte *)0x0) {
      pbVar17 = (byte *)0x0;
    }
    else if (*local_4a8 == 0x2c) {
      lVar9 = strtol((char *)(local_4a8 + 1),&cptr2,10);
      local_468 = lVar9;
      if (cptr2 == (char *)0x0) {
        pbVar16 = (byte *)0x0;
      }
      else {
        pbVar16 = (byte *)cptr2;
        if (*cptr2 == ',') {
          lVar10 = strtol(cptr2 + 1,(char **)&local_4a8,10);
          pbVar17 = local_4a8;
          if (local_4a8 == (byte *)0x0) {
            local_4d4 = 4;
          }
          else {
            local_4d4 = *local_4a8 == 0x2c | 4;
          }
          local_460 = lVar10;
          local_458 = strtol((char *)(local_4a8 + 1),&cptr2,10);
          lVar13 = local_4b0;
          lVar14 = local_458;
          pbVar16 = (byte *)cptr2;
          goto LAB_001329c8;
        }
      }
      local_4d4 = 3;
      lVar13 = local_4b0;
      goto LAB_001329c8;
    }
    local_4d4 = 2;
    lVar13 = local_4b0;
  }
LAB_001329c8:
  local_4a8 = pbVar16;
  if (pbVar16 < pbVar17) {
    local_4a8 = pbVar17;
  }
  if (*local_4a8 == 0x3a) {
    lVar11 = strtol((char *)(local_4a8 + 1),(char **)0x0,10);
  }
  else {
    lVar11 = 0;
  }
  lVar10 = lVar9 * lVar10 * lVar14 * lVar8 * lVar13;
  sVar15 = local_498 * lVar10;
  msize = (sVar15 - (sVar15 + 0xb3f) % 0xb40) + 0x167f;
  local_488 = msize;
  iVar6 = file_openfile(rootfile,0,&diskfile);
  piVar5 = local_448;
  if (iVar6 == 0) {
    iVar6 = mem_createmem(msize,local_448);
    local_4bc = iVar6;
    if (iVar6 == 0) {
      local_498 = sVar15;
      ffimem(&fptr,memTable[*piVar5].memaddrptr,&local_488,0,(_func_void_ptr_void_ptr_size_t *)0x0,
             &local_4bc);
      ffcrim(fptr,local_4c0,local_4d4,&local_478,&local_4bc);
      ffclos(fptr,&local_4bc);
      if (local_4bc < 1) {
        if (0 < lVar11) {
          fseek((FILE *)diskfile,lVar11,0);
        }
        sVar15 = local_498;
        pcVar7 = *memTable[*piVar5].memaddrptr;
        dvalues = (double *)(pcVar7 + 0xb40);
        sVar12 = fread(dvalues,1,local_498,(FILE *)diskfile);
        if (sVar12 != sVar15) {
          local_4bc = 0x6c;
        }
        fclose((FILE *)diskfile);
        if (local_4bc == 0) {
          if ((byte)local_47c != 0) {
            lVar11 = 0;
            if (0 < lVar10) {
              lVar11 = lVar10;
            }
            if ((char)local_4b8 == '\0') {
              for (lVar13 = 0; lVar11 != lVar13; lVar13 = lVar13 + 1) {
                pbVar17 = (byte *)((long)dvalues + lVar13 * 2);
                *pbVar17 = *pbVar17 ^ 0x80;
              }
            }
            else {
              for (lVar13 = 0; lVar11 != lVar13; lVar13 = lVar13 + 1) {
                pbVar17 = (byte *)(pcVar7 + lVar13 * 2 + 0xb41);
                *pbVar17 = *pbVar17 ^ 0x80;
              }
            }
          }
          if ((char)local_4b4 == '\0') {
            if ((byte)((byte)local_47c | local_4c4) == 1) {
              ffswap2((short *)dvalues,lVar10);
            }
            else if ((bool)(bVar3 | bVar1)) {
              ffswap4((int *)dvalues,lVar10);
            }
            else if (bVar4) {
              ffswap8(dvalues,lVar10);
            }
          }
          iVar6 = *piVar5;
          memTable[iVar6].currentpos = 0;
          memTable[iVar6].fitsfilesize = local_488;
          local_4bc = 0;
        }
        else {
          mem_close_free(*piVar5);
          ffpmsg("failed to copy raw file data into memory (mem_rawfile_open)");
        }
      }
      else {
        ffpmsg("failed to write basic image header (mem_rawfile_open)");
        fclose((FILE *)diskfile);
        mem_close_free(*piVar5);
      }
    }
    else {
      ffpmsg("failed to create memory file (mem_rawfile_open)");
      fclose((FILE *)diskfile);
      local_4bc = iVar6;
    }
  }
  else {
    ffpmsg("failed to open raw  binary file (mem_rawfile_open)");
    ffpmsg(rootfile);
    local_4bc = iVar6;
  }
  return local_4bc;
}

Assistant:

int mem_rawfile_open(char *filename, int rwmode, int *hdl)
/*
  This routine creates an empty memory buffer, writes a minimal
  image header, then copies the image data from the raw file into
  memory.  It will byteswap the pixel values if the raw array
  is in little endian byte order.
*/
{
    FILE *diskfile;
    fitsfile *fptr;
    short *sptr;
    int status, endian, datatype, bytePerPix, naxis;
    long dim[5] = {1,1,1,1,1}, ii, nvals, offset = 0;
    size_t filesize = 0, datasize;
    char rootfile[FLEN_FILENAME], *cptr = 0, *cptr2 = 0;
    void *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open raw binary file with WRITE access (mem_rawfile_open)");
        ffpmsg(filename);
        return(READONLY_FILE);
    }

    cptr = strchr(filename, '[');   /* search for opening bracket [ */

    if (!cptr)
    {
        ffpmsg("binary file name missing '[' character (mem_rawfile_open)");
        ffpmsg(filename);
        return(URL_PARSE_ERROR);
    }

    *rootfile = '\0';
    strncat(rootfile, filename, cptr - filename);  /* store the rootname */

    cptr++;

    while (*cptr == ' ')
       cptr++;    /* skip leading blanks */

    /* Get the Data Type of the Image */

    if (*cptr == 'b' || *cptr == 'B')
    {
      datatype = BYTE_IMG;
      bytePerPix = 1;
    }
    else if (*cptr == 'i' || *cptr == 'I')
    {
      datatype = SHORT_IMG;
      bytePerPix = 2;
    }
    else if (*cptr == 'u' || *cptr == 'U')
    {
      datatype = USHORT_IMG;
      bytePerPix = 2;

    }
    else if (*cptr == 'j' || *cptr == 'J')
    {
      datatype = LONG_IMG;
      bytePerPix = 4;
    }  
    else if (*cptr == 'r' || *cptr == 'R' || *cptr == 'f' || *cptr == 'F')
    {
      datatype = FLOAT_IMG;
      bytePerPix = 4;
    }    
    else if (*cptr == 'd' || *cptr == 'D')
    {
      datatype = DOUBLE_IMG;
      bytePerPix = 8;
    }
    else
    {
        ffpmsg("error in raw binary file datatype (mem_rawfile_open)");
        ffpmsg(filename);
        return(URL_PARSE_ERROR);
    }

    cptr++;

    /* get Endian: Big or Little; default is same as the local machine */
    
    if (*cptr == 'b' || *cptr == 'B')
    {
        endian = 0;
        cptr++;
    }
    else if (*cptr == 'l' || *cptr == 'L')
    {
        endian = 1;
        cptr++;
    }
    else
        endian = BYTESWAPPED; /* byteswapped machines are little endian */

    /* read each dimension (up to 5) */

    naxis = 1;
    dim[0] = strtol(cptr, &cptr2, 10);
    
    if (cptr2 && *cptr2 == ',')
    {
      naxis = 2;
      dim[1] = strtol(cptr2+1, &cptr, 10);

      if (cptr && *cptr == ',')
      {
        naxis = 3;
        dim[2] = strtol(cptr+1, &cptr2, 10);

        if (cptr2 && *cptr2 == ',')
        {
          naxis = 4;
          dim[3] = strtol(cptr2+1, &cptr, 10);

          if (cptr && *cptr == ',')
            naxis = 5;
            dim[4] = strtol(cptr+1, &cptr2, 10);
        }
      }
    }

    cptr = maxvalue(cptr, cptr2);

    if (*cptr == ':')   /* read starting offset value */
        offset = strtol(cptr+1, 0, 10);

    nvals = dim[0] * dim[1] * dim[2] * dim[3] * dim[4];
    datasize = nvals * bytePerPix;
    filesize = nvals * bytePerPix + 2880;
    filesize = ((filesize - 1) / 2880 + 1) * 2880; 

    /* open the raw binary disk file */
    status = file_openfile(rootfile, READONLY, &diskfile);
    if (status)
    {
        ffpmsg("failed to open raw  binary file (mem_rawfile_open)");
        ffpmsg(rootfile);
        return(status);
    }

    /* create a memory file with corrct size for the FITS converted raw file */
    status = mem_createmem(filesize, hdl);
    if (status)
    {
        ffpmsg("failed to create memory file (mem_rawfile_open)");
        fclose(diskfile);
        return(status);
    }

    /* open this piece of memory as a new FITS file */
    ffimem(&fptr, (void **) memTable[*hdl].memaddrptr, &filesize, 0, 0, &status);

    /* write the required header keywords */
    ffcrim(fptr, datatype, naxis, dim, &status);

    /* close the FITS file, but keep the memory allocated */
    ffclos(fptr, &status);

    if (status > 0)
    {
        ffpmsg("failed to write basic image header (mem_rawfile_open)");
        fclose(diskfile);
        mem_close_free(*hdl);   /* free up the memory */
        return(status);
    }

    if (offset > 0)
       fseek(diskfile, offset, 0);   /* offset to start of the data */

    /* read the raw data into memory */
    ptr = *memTable[*hdl].memaddrptr + 2880;

    if (fread((char *) ptr, 1, datasize, diskfile) != datasize)
      status = READ_ERROR;

    fclose(diskfile);  /* close the raw binary disk file */

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to copy raw file data into memory (mem_rawfile_open)");
        return(status);
    }

    if (datatype == USHORT_IMG)  /* have to subtract 32768 from each unsigned */
    {                            /* value to conform to FITS convention. More */
                                 /* efficient way to do this is to just flip  */
                                 /* the most significant bit.                 */

      sptr = (short *) ptr;

      if (endian == BYTESWAPPED)  /* working with native format */
      {
        for (ii = 0; ii < nvals; ii++, sptr++)
        {
          *sptr =  ( *sptr ) ^ 0x8000;
        }
      }
      else  /* pixels are byteswapped WRT the native format */
      {
        for (ii = 0; ii < nvals; ii++, sptr++)
        {
          *sptr =  ( *sptr ) ^ 0x80;
        }
      }
    }

    if (endian)  /* swap the bytes if array is in little endian byte order */
    {
      if (datatype == SHORT_IMG || datatype == USHORT_IMG)
      {
        ffswap2( (short *) ptr, nvals);
      }
      else if (datatype == LONG_IMG || datatype == FLOAT_IMG)
      {
        ffswap4( (INT32BIT *) ptr, nvals);
      }

      else if (datatype == DOUBLE_IMG)
      {
        ffswap8( (double *) ptr, nvals);
      }
    }

    memTable[*hdl].currentpos = 0;           /* save starting position */
    memTable[*hdl].fitsfilesize=filesize;    /* and initial file size  */

    return(0);
}